

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::WriteLocalAllRules
          (cmLocalUnixMakefileGenerator3 *this,ostream *ruleFileStream)

{
  cmOutputConverter *this_00;
  cmGeneratorTarget *pcVar1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  cmMakefile *this_01;
  size_type __position;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  ostream *poVar5;
  string *psVar6;
  char *pcVar7;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar8;
  vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *pvVar9;
  cmLocalUnixMakefileGenerator3 *this_02;
  string runRule;
  string mf2Dir;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  commands;
  allocator local_261;
  pointer local_260;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  string recursiveTarget;
  string local_218;
  string progressDir;
  string cmakefileName;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  
  WriteDisclaimer(this,ruleFileStream);
  recursiveTarget._M_dataplus._M_p = (pointer)0x0;
  recursiveTarget._M_string_length = 0;
  recursiveTarget.field_2._M_allocated_capacity = 0;
  progressDir._M_dataplus._M_p = (pointer)0x0;
  progressDir._M_string_length = 0;
  progressDir.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string((string *)&cmakefileName,"all",(allocator *)&mf2Dir);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&recursiveTarget,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::__cxx11::string::string((string *)&cmakefileName,"default_target",(allocator *)&mf2Dir);
  WriteMakeRule(this,ruleFileStream,"Default target executed when no arguments are given to make.",
                &cmakefileName,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&recursiveTarget,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&progressDir,true,false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  iVar3 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x27])();
  if ((char)iVar3 != '\0') {
    mf2Dir._M_dataplus._M_p = (pointer)0x0;
    mf2Dir._M_string_length = 0;
    mf2Dir.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&cmakefileName,".NOTPARALLEL",(allocator *)&runRule);
    WriteMakeRule(this,ruleFileStream,
                  "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
                  &cmakefileName,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&mf2Dir,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&progressDir,false,false);
    std::__cxx11::string::~string((string *)&cmakefileName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mf2Dir);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&progressDir);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&recursiveTarget);
  this_02 = this;
  WriteSpecialTargetsTop(this,ruleFileStream);
  WriteDivider(this_02,ruleFileStream);
  poVar5 = std::operator<<(ruleFileStream,"# Targets provided globally by CMake.\n");
  std::operator<<(poVar5,"\n");
  std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
            (&targets,&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GeneratorTargets)
  ;
  while (targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_start !=
         targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
         _M_impl.super__Vector_impl_data._M_finish) {
    local_260 = targets.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    TVar4 = cmGeneratorTarget::GetType
                      (*targets.
                        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    if (TVar4 == GLOBAL_TARGET) {
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(*local_260);
      std::operator+(&cmakefileName,"Special rule for the target ",psVar6);
      mf2Dir._M_dataplus._M_p = (pointer)0x0;
      mf2Dir._M_string_length = 0;
      mf2Dir.field_2._M_allocated_capacity = 0;
      runRule._M_dataplus._M_p = (pointer)0x0;
      runRule._M_string_length = 0;
      runRule.field_2._M_allocated_capacity = 0;
      pcVar1 = *local_260;
      std::__cxx11::string::string
                ((string *)&recursiveTarget,"EchoString",(allocator *)&progressDir);
      pcVar7 = cmGeneratorTarget::GetProperty(pcVar1,&recursiveTarget);
      std::__cxx11::string::~string((string *)&recursiveTarget);
      __position = runRule._M_string_length;
      if (pcVar7 == (char *)0x0) {
        pcVar7 = "Running external command ...";
      }
      psVar8 = cmGeneratorTarget::GetUtilities_abi_cxx11_(*local_260);
      __first._M_node = (psVar8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      psVar8 = cmGeneratorTarget::GetUtilities_abi_cxx11_(*local_260);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      insert<std::_Rb_tree_const_iterator<std::__cxx11::string>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                 (const_iterator)__position,__first,
                 (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  )&(psVar8->_M_t)._M_impl.super__Rb_tree_header);
      std::__cxx11::string::string((string *)&recursiveTarget,pcVar7,(allocator *)&progressDir);
      AppendEcho(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,&recursiveTarget,EchoGlobal,(EchoProgress *)0x0);
      std::__cxx11::string::~string((string *)&recursiveTarget);
      pcVar1 = *local_260;
      pvVar9 = cmGeneratorTarget::GetPreBuildCommands(pcVar1);
      AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&runRule,pvVar9);
      pvVar9 = cmGeneratorTarget::GetPostBuildCommands(pcVar1);
      AppendCustomDepends(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&runRule,pvVar9);
      pvVar9 = cmGeneratorTarget::GetPreBuildCommands(pcVar1);
      AppendCustomCommands
                (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,pvVar9,pcVar1,START_OUTPUT);
      pvVar9 = cmGeneratorTarget::GetPostBuildCommands(pcVar1);
      AppendCustomCommands
                (this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&mf2Dir,pvVar9,pcVar1,START_OUTPUT);
      psVar6 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar1);
      std::__cxx11::string::string((string *)&recursiveTarget,(string *)psVar6);
      WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&runRule,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&mf2Dir,true,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&runRule);
      bVar2 = std::operator==(&recursiveTarget,"install");
      if (bVar2) {
LAB_0039a1cb:
        std::__cxx11::string::string
                  ((string *)&progressDir,"preinstall/fast",(allocator *)&local_218);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&runRule,
                   &progressDir);
        std::__cxx11::string::~string((string *)&progressDir);
      }
      else {
        bVar2 = std::operator==(&recursiveTarget,"install_local");
        if (bVar2) goto LAB_0039a1cb;
        bVar2 = std::operator==(&recursiveTarget,"install_strip");
        if (bVar2) goto LAB_0039a1cb;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&runRule,&recursiveTarget);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mf2Dir);
      }
      std::__cxx11::string::append((char *)&recursiveTarget);
      WriteMakeRule(this,ruleFileStream,cmakefileName._M_dataplus._M_p,&recursiveTarget,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&runRule,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&mf2Dir,true,false);
      std::__cxx11::string::~string((string *)&recursiveTarget);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&runRule);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&mf2Dir);
      std::__cxx11::string::~string((string *)&cmakefileName);
    }
    targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_260 + 1;
  }
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  depends.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  commands.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&recursiveTarget,pcVar7,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&recursiveTarget);
  std::__cxx11::string::string
            ((string *)&cmakefileName,"cmake_check_build_system",(allocator *)&progressDir);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::string((string *)&progressDir,pcVar7,(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&progressDir);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::operator<<((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ");
  this_00 = &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter;
  cmOutputConverter::Convert(&mf2Dir,this_00,&progressDir,FULL,SHELL);
  std::operator<<((ostream *)&cmakefileName,(string *)&mf2Dir);
  std::__cxx11::string::~string((string *)&mf2Dir);
  std::__cxx11::string::string((string *)&mf2Dir,"/CMakeFiles",(allocator *)&runRule);
  std::__cxx11::string::append((char *)&mf2Dir);
  ConvertToFullPath(&runRule,this,&mf2Dir);
  poVar5 = std::operator<<((ostream *)&cmakefileName," ");
  cmOutputConverter::Convert(&local_218,this_00,&runRule,FULL,SHELL);
  std::operator<<(poVar5,(string *)&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&runRule);
  std::__cxx11::string::~string((string *)&mf2Dir);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::__cxx11::string::string((string *)&mf2Dir,"CMakeFiles/",(allocator *)&cmakefileName);
  std::__cxx11::string::append((char *)&mf2Dir);
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar7,START_OUTPUT);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmakefileName);
  std::operator<<((ostream *)&cmakefileName,"$(CMAKE_COMMAND) -E cmake_progress_start ");
  cmOutputConverter::Convert(&runRule,this_00,&progressDir,FULL,SHELL);
  std::operator<<((ostream *)&cmakefileName,(string *)&runRule);
  std::__cxx11::string::~string((string *)&runRule);
  std::operator<<((ostream *)&cmakefileName," 0");
  std::__cxx11::stringbuf::str();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,&runRule
            );
  std::__cxx11::string::~string((string *)&runRule);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmakefileName);
  std::__cxx11::string::string((string *)&cmakefileName,"all",(allocator *)&runRule);
  WriteMakeRule(this,ruleFileStream,"The main all target",&cmakefileName,&depends,&commands,true,
                false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::assign((char *)&recursiveTarget);
  std::__cxx11::string::append((char *)&recursiveTarget);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&depends);
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar7,START_OUTPUT);
  std::__cxx11::string::string((string *)&cmakefileName,"clean",(allocator *)&runRule);
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&depends);
  std::__cxx11::string::string((string *)&cmakefileName,"clean",(allocator *)&runRule);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::__cxx11::string::string((string *)&cmakefileName,"clean/fast",(allocator *)&runRule);
  WriteMakeRule(this,ruleFileStream,"The main clean target",&cmakefileName,&depends,&commands,true,
                false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)this);
  std::__cxx11::string::assign((char *)&recursiveTarget);
  std::__cxx11::string::append((char *)&recursiveTarget);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&depends);
  this_01 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string
            ((string *)&cmakefileName,"CMAKE_SKIP_INSTALL_ALL_DEPENDENCY",(allocator *)&runRule);
  pcVar7 = cmMakefile::GetDefinition(this_01,&cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  if (pcVar7 != (char *)0x0) {
    bVar2 = cmSystemTools::IsOff(pcVar7);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)&cmakefileName,"cmake_check_build_system",(allocator *)&runRule);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
                 &cmakefileName);
      goto LAB_0039a831;
    }
  }
  std::__cxx11::string::string((string *)&cmakefileName,"all",(allocator *)&runRule);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&depends,
             &cmakefileName);
LAB_0039a831:
  std::__cxx11::string::~string((string *)&cmakefileName);
  GetRecursiveMakeCall(&cmakefileName,this,mf2Dir._M_dataplus._M_p,&recursiveTarget);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&commands,
             &cmakefileName);
  std::__cxx11::string::~string((string *)&cmakefileName);
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar7,START_OUTPUT);
  std::__cxx11::string::string((string *)&cmakefileName,"preinstall",(allocator *)&runRule);
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&depends);
  std::__cxx11::string::string((string *)&cmakefileName,"preinstall/fast",(allocator *)&runRule);
  WriteMakeRule(this,ruleFileStream,"Prepare targets for installation.",&cmakefileName,&depends,
                &commands,true,false);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&depends);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&commands);
  std::__cxx11::string::string((string *)&cmakefileName,"CMakeFiles/",(allocator *)&runRule);
  std::__cxx11::string::append((char *)&cmakefileName);
  std::__cxx11::string::string
            ((string *)&runRule,"$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)",
             (allocator *)&local_218);
  std::__cxx11::string::append((char *)&runRule);
  cmOutputConverter::Convert(&local_218,this_00,&cmakefileName,NONE,SHELL);
  std::__cxx11::string::append((string *)&runRule);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::append((char *)&runRule);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&commands,&runRule);
  pcVar7 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)this);
  CreateCDCommand(this,&commands,pcVar7,START_OUTPUT);
  std::__cxx11::string::string((string *)&local_218,"depend",&local_261);
  WriteMakeRule(this,ruleFileStream,"clear depends",&local_218,&depends,&commands,true,false);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&runRule);
  std::__cxx11::string::~string((string *)&cmakefileName);
  std::__cxx11::string::~string((string *)&mf2Dir);
  std::__cxx11::string::~string((string *)&progressDir);
  std::__cxx11::string::~string((string *)&recursiveTarget);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&commands);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&depends);
  std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
            (&targets.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>)
  ;
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3
::WriteLocalAllRules(std::ostream& ruleFileStream)
{
  this->WriteDisclaimer(ruleFileStream);

  // Write the main entry point target.  This must be the VERY first
  // target so that make with no arguments will run it.
  {
  // Just depend on the all target to drive the build.
  std::vector<std::string> depends;
  std::vector<std::string> no_commands;
  depends.push_back("all");

  // Write the rule.
  this->WriteMakeRule(ruleFileStream,
                      "Default target executed when no arguments are "
                      "given to make.",
                      "default_target",
                      depends,
                      no_commands, true);

  // Help out users that try "gmake target1 target2 -j".
  cmGlobalUnixMakefileGenerator3* gg =
    static_cast<cmGlobalUnixMakefileGenerator3*>(this->GlobalGenerator);
  if(gg->AllowNotParallel())
    {
    std::vector<std::string> no_depends;
    this->WriteMakeRule(ruleFileStream,
      "Allow only one \"make -f Makefile2\" at a time, but pass parallelism.",
      ".NOTPARALLEL", no_depends, no_commands, false);
    }
  }

  this->WriteSpecialTargetsTop(ruleFileStream);

  // Include the progress variables for the target.
  // Write all global targets
  this->WriteDivider(ruleFileStream);
  ruleFileStream
    << "# Targets provided globally by CMake.\n"
    << "\n";
  std::vector<cmGeneratorTarget*> targets = this->GetGeneratorTargets();
  std::vector<cmGeneratorTarget*>::iterator glIt;
  for ( glIt = targets.begin(); glIt != targets.end(); ++ glIt )
    {
    if ( (*glIt)->GetType() == cmState::GLOBAL_TARGET )
      {
      std::string targetString = "Special rule for the target " +
          (*glIt)->GetName();
      std::vector<std::string> commands;
      std::vector<std::string> depends;

      const char* text = (*glIt)->GetProperty("EchoString");
      if ( !text )
        {
        text = "Running external command ...";
        }
      depends.insert(depends.end(), (*glIt)->GetUtilities().begin(),
                     (*glIt)->GetUtilities().end());
      this->AppendEcho(commands, text,
                       cmLocalUnixMakefileGenerator3::EchoGlobal);

      cmGeneratorTarget* gt = *glIt;

      // Global targets store their rules in pre- and post-build commands.
      this->AppendCustomDepends(depends,
                                gt->GetPreBuildCommands());
      this->AppendCustomDepends(depends,
                                gt->GetPostBuildCommands());
      this->AppendCustomCommands(commands,
                                 gt->GetPreBuildCommands(),
                                 gt,
                                 cmLocalGenerator::START_OUTPUT);
      this->AppendCustomCommands(commands,
                                 gt->GetPostBuildCommands(),
                                 gt,
                                 cmLocalGenerator::START_OUTPUT);
      std::string targetName = gt->GetName();
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);

      // Provide a "/fast" version of the target.
      depends.clear();
      if((targetName == "install")
          || (targetName == "install_local")
          || (targetName == "install_strip"))
        {
        // Provide a fast install target that does not depend on all
        // but has the same command.
        depends.push_back("preinstall/fast");
        }
      else
        {
        // Just forward to the real target so at least it will work.
        depends.push_back(targetName);
        commands.clear();
        }
      targetName += "/fast";
      this->WriteMakeRule(ruleFileStream, targetString.c_str(),
                          targetName, depends, commands, true);
      }
    }

  std::vector<std::string> depends;
  std::vector<std::string> commands;

  // Write the all rule.
  std::string recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/all";

  depends.push_back("cmake_check_build_system");

  std::string progressDir = this->GetBinaryDirectory();
  progressDir += cmake::GetCMakeFilesDirectory();
    {
    std::ostringstream progCmd;
    progCmd <<
      "$(CMAKE_COMMAND) -E cmake_progress_start ";
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);

    std::string progressFile = cmake::GetCMakeFilesDirectory();
    progressFile += "/progress.marks";
    std::string progressFileNameFull =
      this->ConvertToFullPath(progressFile);
    progCmd << " " << this->Convert(progressFileNameFull,
                                    cmLocalGenerator::FULL,
                                    cmLocalGenerator::SHELL);
    commands.push_back(progCmd.str());
    }
  std::string mf2Dir = cmake::GetCMakeFilesDirectoryPostSlash();
  mf2Dir += "Makefile2";
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
    {
    std::ostringstream progCmd;
    progCmd << "$(CMAKE_COMMAND) -E cmake_progress_start "; // # 0
    progCmd << this->Convert(progressDir,
                             cmLocalGenerator::FULL,
                             cmLocalGenerator::SHELL);
    progCmd << " 0";
    commands.push_back(progCmd.str());
    }
  this->WriteMakeRule(ruleFileStream, "The main all target", "all",
                      depends, commands, true);

  // Write the clean rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/clean";
  commands.clear();
  depends.clear();
  commands.push_back(this->GetRecursiveMakeCall(mf2Dir.c_str(),
                                                recursiveTarget));
  this->CreateCDCommand(commands,
                                this->GetBinaryDirectory(),
                                cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean",
                      depends, commands, true);
  commands.clear();
  depends.clear();
  depends.push_back("clean");
  this->WriteMakeRule(ruleFileStream, "The main clean target", "clean/fast",
                      depends, commands, true);

  // Write the preinstall rule.
  recursiveTarget = this->GetCurrentBinaryDirectory();
  recursiveTarget += "/preinstall";
  commands.clear();
  depends.clear();
  const char* noall =
    this->Makefile->GetDefinition("CMAKE_SKIP_INSTALL_ALL_DEPENDENCY");
  if(!noall || cmSystemTools::IsOff(noall))
    {
    // Drive the build before installing.
    depends.push_back("all");
    }
  else
    {
    // At least make sure the build system is up to date.
    depends.push_back("cmake_check_build_system");
    }
  commands.push_back
    (this->GetRecursiveMakeCall(mf2Dir.c_str(), recursiveTarget));
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall", depends, commands, true);
  depends.clear();
  this->WriteMakeRule(ruleFileStream, "Prepare targets for installation.",
                      "preinstall/fast", depends, commands, true);

  // write the depend rule, really a recompute depends rule
  depends.clear();
  commands.clear();
  std::string cmakefileName = cmake::GetCMakeFilesDirectoryPostSlash();
  cmakefileName += "Makefile.cmake";
  std::string runRule =
    "$(CMAKE_COMMAND) -H$(CMAKE_SOURCE_DIR) -B$(CMAKE_BINARY_DIR)";
  runRule += " --check-build-system ";
  runRule += this->Convert(cmakefileName,cmLocalGenerator::NONE,
                           cmLocalGenerator::SHELL);
  runRule += " 1";
  commands.push_back(runRule);
  this->CreateCDCommand(commands,
                        this->GetBinaryDirectory(),
                        cmLocalGenerator::START_OUTPUT);
  this->WriteMakeRule(ruleFileStream, "clear depends",
                      "depend",
                      depends, commands, true);
}